

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_assign_fwd.h
# Opt level: O1

void dlib::
     matrix_assign_big<dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>
               (matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                *dest,matrix_exp<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>
                      *src)

{
  rgb_pixel *prVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  if (0 < *(long *)(src + 8)) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      lVar4 = *(long *)(src + 0x10);
      if (0 < lVar4) {
        lVar5 = 0;
        lVar6 = 0;
        do {
          lVar4 = lVar4 * lVar2 + *(long *)src;
          lVar7 = (dest->data).nc_ * lVar2;
          prVar1 = (dest->data).data;
          (&prVar1->blue)[lVar5 + lVar7] = *(uchar *)(lVar5 + 2 + lVar4);
          *(undefined2 *)(&prVar1->red + lVar5 + lVar7) = *(undefined2 *)(lVar5 + lVar4);
          lVar6 = lVar6 + 1;
          lVar4 = *(long *)(src + 0x10);
          lVar5 = lVar5 + 3;
        } while (lVar6 < lVar4);
      }
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 3;
    } while (lVar3 < *(long *)(src + 8));
  }
  return;
}

Assistant:

inline typename disable_if<ma::has_column_major_layout<EXP1> >::type  
    matrix_assign_default (
        EXP1& dest,
        const EXP2& src
    )
    /*!
        requires
            - src.destructively_aliases(dest) == false
            - dest.nr() == src.nr()
            - dest.nc() == src.nc()
        ensures
            - #dest == src
    !*/
    {
        for (long r = 0; r < src.nr(); ++r)
        {
            for (long c = 0; c < src.nc(); ++c)
            {
                dest(r,c) = src(r,c);
            }
        }
    }